

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

String * __thiscall
capnp::JsonCodec::encode(String *__return_storage_ptr__,JsonCodec *this,Reader *value,Type type)

{
  Builder output;
  Reader value_00;
  Builder json;
  MallocMessageBuilder message;
  StructBuilder local_1f0;
  Builder local_1c8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  Reader local_180;
  PointerBuilder local_138;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_1c8,&local_120.super_MessageBuilder);
  local_138.pointer = local_1c8.builder.pointer;
  local_138.segment = local_1c8.builder.segment;
  local_138.capTable = local_1c8.builder.capTable;
  capnp::_::PointerBuilder::getStruct(&local_1f0,&local_138,(StructSize)0x10002,(word *)0x0);
  DynamicValue::Reader::Reader(&local_180,value);
  output._builder.capTable = local_1f0.capTable;
  output._builder.segment = local_1f0.segment;
  output._builder.data = local_1f0.data;
  output._builder.pointers = local_1f0.pointers;
  output._builder.dataSize = local_1f0.dataSize;
  output._builder.pointerCount = local_1f0.pointerCount;
  output._builder._38_2_ = local_1f0._38_2_;
  encode(this,&local_180,type,output);
  DynamicValue::Reader::~Reader(&local_180);
  capnp::_::StructBuilder::asReader(&local_1f0);
  value_00._reader.capTable = (CapTableReader *)uStack_1a8;
  value_00._reader.segment = (SegmentReader *)local_1b0;
  value_00._reader.data = (void *)local_1a0;
  value_00._reader.pointers = (WirePointer *)uStack_198;
  value_00._reader.dataSize = (undefined4)local_190;
  value_00._reader.pointerCount = local_190._4_2_;
  value_00._reader._38_2_ = local_190._6_2_;
  value_00._reader._40_8_ = uStack_188;
  encodeRaw(__return_storage_ptr__,this,value_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(DynamicValue::Reader value, Type type) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  encode(value, type, json);
  return encodeRaw(json);
}